

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageHeader_ValidVersion_Test::TestBody
          (CoapTest_CoapMessageHeader_ValidVersion_Test *this)

{
  undefined8 *puVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  initializer_list<unsigned_char> __l;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  shared_ptr<ot::commissioner::coap::Message> message;
  Error error;
  ByteArray buffer;
  AssertHelper local_a0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  undefined8 *local_90;
  Message local_88;
  undefined8 *local_80;
  undefined1 local_70 [20];
  int local_5c;
  undefined1 local_58 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  local_58._0_4_ = 0x40;
  __l._M_len = 4;
  __l._M_array = local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_30,__l,(allocator_type *)&local_88);
  local_58._0_4_ = _S_red;
  local_58._16_8_ = (_Base_ptr)0x0;
  local_58[0x18] = '\0';
  local_58._8_8_ = (_Base_ptr)(local_58 + 0x18);
  Message::Deserialize((Message *)local_70,(Error *)local_58,&local_30);
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            ((internal *)&local_88,"message","nullptr",
             (shared_ptr<ot::commissioner::coap::Message> *)local_70,&local_98._M_head_impl);
  if (local_88.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_80;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x67,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  puVar1 = local_80;
  if (local_80 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_80 != local_80 + 2) {
      operator_delete((undefined8 *)*local_80);
    }
    operator_delete(puVar1);
  }
  local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_88,"error","ErrorCode::kNone",(Error *)local_58,
             (ErrorCode *)&local_98);
  if (local_88.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_80;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x68,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  puVar1 = local_80;
  if (local_80 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_80 != local_80 + 2) {
      operator_delete((undefined8 *)*local_80);
    }
    operator_delete(puVar1);
  }
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_98._M_head_impl._1_7_,*(undefined1 *)(Header *)local_70._0_8_) &
       0xffffffffffffff03);
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)&local_88,"message->GetVersion()","kVersion1",(uchar *)&local_98,
             "\x01@\x01");
  if (local_88.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_80;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x6a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  puVar1 = local_80;
  if (local_80 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_80 != local_80 + 2) {
      operator_delete((undefined8 *)*local_80);
    }
    operator_delete(puVar1);
  }
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_98._M_head_impl._1_7_,*(byte *)(Header *)local_70._0_8_ >> 2) &
       0xffffffffffffff03);
  local_a0.data_ = local_a0.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<ot::commissioner::coap::Type,ot::commissioner::coap::Type>
            ((internal *)&local_88,"message->GetType()","Type::kConfirmable",(Type *)&local_98,
             (Type *)&local_a0);
  if (local_88.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_80;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x6b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  puVar1 = local_80;
  if (local_80 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_80 != local_80 + 2) {
      operator_delete((undefined8 *)*local_80);
    }
    operator_delete(puVar1);
  }
  bVar2 = *(byte *)(Header *)local_70._0_8_ >> 4;
  bVar3 = 8;
  if (bVar2 < 8) {
    bVar3 = bVar2;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,
             ((Header *)local_70._0_8_)->mToken,((Header *)local_70._0_8_)->mToken + bVar3,
             (allocator_type *)&local_5c);
  local_a0.data_ =
       (AssertHelperData *)
       ((long)local_80 -
       CONCAT71(local_88.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_7_,
                local_88.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_1_));
  local_5c = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,"message->GetToken().size()","0",(unsigned_long *)&local_a0,
             &local_5c);
  if ((void *)CONCAT71(local_88.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._1_7_,
                       local_88.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_));
  }
  if (local_98._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_88);
    if (local_90 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_90;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x6c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((long *)CONCAT71(local_88.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_88.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_90 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_90 != local_90 + 2) {
      operator_delete((undefined8 *)*local_90);
    }
    operator_delete(local_90);
  }
  local_98._M_head_impl._0_1_ = (internal)((Header *)local_70._0_8_)->mCode;
  local_a0.data_ = local_a0.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<ot::commissioner::coap::Code,ot::commissioner::coap::Code>
            ((internal *)&local_88,"message->GetCode()","utils::from_underlying<Code>(0)",
             (Code *)&local_98,(Code *)&local_a0);
  if (local_88.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_80;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x6d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  puVar1 = local_80;
  if (local_80 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_80 != local_80 + 2) {
      operator_delete((undefined8 *)*local_80);
    }
    operator_delete(puVar1);
  }
  local_a0.data_._0_2_ = ((Header *)local_70._0_8_)->mMessageId;
  local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)&local_88,"message->GetMessageId()","0",(unsigned_short *)&local_a0,
             (int *)&local_98);
  if (local_88.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (undefined8 *)0x0) {
      pcVar4 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar4 = (char *)*local_80;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x6e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if (local_80 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_80 != local_80 + 2) {
      operator_delete((undefined8 *)*local_80);
    }
    operator_delete(local_80);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  if ((_Base_ptr)local_58._8_8_ != (_Base_ptr)(local_58 + 0x18)) {
    operator_delete((void *)local_58._8_8_);
  }
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_ValidVersion)
{
    ByteArray buffer{0x40, 0x00, 0x00, 0x00};
    Error     error;
    auto      message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetVersion(), kVersion1);
    EXPECT_EQ(message->GetType(), Type::kConfirmable);
    EXPECT_EQ(message->GetToken().size(), 0);
    EXPECT_EQ(message->GetCode(), utils::from_underlying<Code>(0));
    EXPECT_EQ(message->GetMessageId(), 0);
}